

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,2,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  _Map_pointer pppVar4;
  _Map_pointer pppVar5;
  comm *comm_00;
  unsigned_long uVar6;
  long *plVar7;
  _Elt_pointer ppVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  int iVar12;
  ulong uVar13;
  comm *pcVar14;
  pointer puVar15;
  unsigned_long *puVar16;
  long lVar17;
  ulong uVar18;
  _Elt_pointer ppVar19;
  long lVar20;
  _Elt_pointer ppVar21;
  unsigned_long uVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  ulong uVar25;
  _Elt_pointer ppVar26;
  ulong uVar27;
  ulong uVar28;
  _Elt_pointer ppVar29;
  _Elt_pointer ppVar30;
  long lVar31;
  ulong *puVar32;
  ulong uVar33;
  _Elt_pointer ppVar34;
  pair<unsigned_long,_unsigned_long> *ppVar35;
  _Elt_pointer ppVar36;
  int iVar37;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar38;
  _Elt_pointer ppVar39;
  bool bVar40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_190;
  _Elt_pointer local_188;
  _Elt_pointer local_180;
  comm *local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  _Elt_pointer local_140;
  pair<unsigned_long,_unsigned_long> local_138;
  _Elt_pointer local_128;
  unsigned_long local_120;
  unsigned_long local_118;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_110;
  size_type local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_168 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_160 = right_nsv;
  local_120 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_f8 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_178 = comm;
  uVar6 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_f8,comm);
  lVar31 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_170 = in;
  if (lVar31 != 0) {
    lVar31 = lVar31 >> 3;
LAB_00133966:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar31 + -1] < ppVar8[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00133966;
        }
      }
      while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar31 + -1] != ppVar8[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar6 - 1) + lVar31);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar31 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
  }
  local_50.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_158,&local_50,&local_70,(allocator_type *)&local_a8);
  pvVar2 = *(void **)local_168;
  *(pointer *)local_168 =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_168 + 8) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_168 + 0x10) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar4 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_190 = (_Elt_pointer)
              (((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Elt_pointer)0x0)) * 0x20);
  local_180 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar8 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar38 = local_170;
  if (local_190 == (_Elt_pointer)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_170 = pvVar38, ppVar8 < pppVar5; ppVar8 = (_Elt_pointer)&ppVar8->second) {
    operator_delete((void *)ppVar8->second);
    pvVar38 = local_170;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar4;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_180;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_188;
  if ((pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
LAB_00133c18:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if ((pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13] < ppVar8[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00133c18;
        }
      }
      while (lVar31 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar31 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        uVar22 = (pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
        if (uVar22 != ppVar8[-1].first) break;
        uVar25 = lVar31 - 1;
        if (uVar25 < 0x20) {
          ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar9 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar11 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar18 = uVar25 >> 5 | 0xf800000000000000;
          if (1 < lVar31) {
            uVar18 = uVar25 >> 5;
          }
          ppVar9 = (_Elt_pointer)
                   ((unsigned_long *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                   uVar18);
          ppVar11 = (_Elt_pointer)ppVar9->first;
          ppVar8 = ppVar11 + uVar25 + uVar18 * -0x20;
        }
        if (ppVar8 == ppVar11) {
          ppVar8 = (_Elt_pointer)(ppVar9[-1].second + 0x200);
        }
        if (uVar22 != ppVar8[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar13 + uVar6);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar13];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(pvVar38->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar38->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar11 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar13 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar40 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_140 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_90 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_168,*(undefined8 *)(local_168 + 8));
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar4 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar31 = (long)ppVar8 - (long)local_188;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar31 = (lVar31 >> 4) + ((long)ppVar9 - (long)ppVar11 >> 4) +
           (((uVar13 >> 3) - 1) + (ulong)bVar40) * 0x20;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_128 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar8 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar14 = local_178;
  if (lVar31 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_180 = ppVar9, local_178 = pcVar14, ppVar8 < pppVar5;
      ppVar8 = (_Elt_pointer)&ppVar8->second) {
    operator_delete((void *)ppVar8->second);
    ppVar9 = local_180;
    pcVar14 = local_178;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar4;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_180;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_128;
  if (lVar31 + (long)local_190 != *(long *)(local_168 + 8) - *(long *)local_168 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_158,&local_118,1,pcVar14);
  local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(long)pcVar14->m_size,(value_type_conflict *)&local_c0,
             (allocator_type *)&local_f0);
  local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,(long)pcVar14->m_size,(value_type_conflict *)&local_f0,
             (allocator_type *)&local_d8);
  comm_00 = local_178;
  iVar1 = pcVar14->m_rank;
  lVar31 = (long)iVar1;
  if (0 < lVar31) {
    uVar13 = *(ulong *)((long)local_158.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar31 * 8 + -8);
    lVar17 = lVar31;
    uVar22 = 0;
    do {
      lVar20 = lVar17 + -1;
      ppVar8 = (_Elt_pointer)(uVar22 + 1);
      if (uVar22 + 1 < local_190) {
        ppVar8 = local_190;
      }
      puVar32 = (ulong *)(uVar22 * 0x10 + *(long *)local_168);
      uVar23 = uVar22 - 1;
      do {
        uVar24 = (long)ppVar8 - 1;
        if ((1 - (long)ppVar8) + uVar23 == -1) break;
        uVar25 = *puVar32;
        uVar24 = uVar23 + 1;
        puVar32 = puVar32 + 2;
        uVar23 = uVar24;
      } while (*(ulong *)((long)local_158.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar20 * 8) <= uVar25);
      uVar25 = *(ulong *)((long)local_158.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar20 * 8);
      iVar37 = 0x12;
      if (uVar25 <= uVar13) {
        *(unsigned_long *)
         ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar20 * 8) = (uVar24 - uVar22) + 1;
        *(unsigned_long *)
         ((long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar20 * 8) = uVar22;
        iVar37 = (uint)(*(ulong *)((long)local_158.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20 * 8) <
                       local_118) << 4;
        uVar13 = uVar25;
      }
    } while (((iVar37 == 0x12) || (iVar37 == 0)) &&
            (bVar40 = 1 < lVar17, lVar17 = lVar20, uVar22 = uVar24, bVar40));
  }
  iVar37 = local_178->m_size;
  if ((iVar1 < iVar37 + -1) && (iVar1 + 1 < iVar37)) {
    lVar17 = *(long *)local_168;
    uVar18 = *(long *)(local_168 + 8) - lVar17 >> 4;
    uVar13 = ((unsigned_long *)
             ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar31];
    local_188 = (_Elt_pointer)
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_180 = (_Elt_pointer)
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar31 = lVar31 + 1;
    uVar25 = uVar18 - 1;
    iVar12 = iVar1;
    do {
      uVar28 = uVar25;
      if (iVar1 < iVar12) {
        uVar33 = uVar25 + 1;
        if (uVar25 + 1 < uVar18) {
          uVar33 = uVar18;
        }
        uVar27 = uVar25 - 1;
        puVar32 = (ulong *)(uVar25 * 0x10 + lVar17 + 0x10);
        do {
          uVar28 = uVar33 - 1;
          if (uVar18 <= uVar27 + 2) break;
          uVar28 = uVar27 + 1;
          uVar3 = *puVar32;
          uVar27 = uVar28;
          puVar32 = puVar32 + 2;
        } while (uVar3 <= uVar13);
      }
      ppVar8 = (_Elt_pointer)uVar25;
      if (local_190 < uVar25) {
        puVar32 = (ulong *)(uVar25 * 0x10 + lVar17);
        do {
          ppVar8 = (_Elt_pointer)uVar25;
          if (*puVar32 <
              local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar31]) break;
          uVar25 = uVar25 - 1;
          puVar32 = puVar32 + -2;
          ppVar8 = local_190;
        } while (local_190 < uVar25);
      }
      uVar25 = local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar31];
      iVar12 = 0x17;
      if (uVar25 <= uVar13) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar31] = (uVar28 - (long)ppVar8) + 1;
        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar31] = (unsigned_long)ppVar8;
        uVar13 = uVar25;
        iVar12 = 0;
        if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar31] < local_118) {
          iVar12 = 0x15;
        }
      }
      if ((iVar12 != 0x17) && (iVar12 != 0)) break;
      iVar12 = (int)lVar31;
      lVar31 = lVar31 + 1;
      uVar25 = (ulong)ppVar8;
    } while (iVar37 != (int)lVar31);
  }
  mxx::all2all<unsigned_long>(&local_f0,&local_a8,local_178);
  mxx::impl::get_displacements<unsigned_long>(&local_d8,&local_f0);
  local_80 = (_Elt_pointer)
             (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] +
             local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_110,(size_type)local_80,(allocator_type *)&local_138);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_168,&local_a8,&local_c0,
             local_110.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f0,&local_d8,comm_00);
  local_188 = (_Elt_pointer)
              local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_160,local_f8);
  pppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar4 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  pvVar38 = local_170;
  for (ppVar8 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      local_170 = pvVar38, ppVar8 < pppVar5; ppVar8 = (_Elt_pointer)&ppVar8->second) {
    operator_delete((void *)ppVar8->second);
    pvVar38 = local_170;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar4;
  lVar31 = (long)(pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_178;
  if (lVar31 != 0) {
    lVar31 = lVar31 >> 3;
    local_180 = (_Elt_pointer)(uVar6 - 1);
    do {
      local_190 = (_Elt_pointer)((long)local_180 + lVar31);
      lVar31 = lVar31 + -1;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_178 = (comm *)(pvVar38->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
        do {
          ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar8 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (ppVar8[-1].first <= *(ulong *)((long)local_178 + lVar31 * 8)) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar22 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar22 + 0x1f8) - uVar6] =
                 (unsigned_long)local_190;
            ppVar8 = (_Elt_pointer)(uVar22 + 0x200);
          }
          else {
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar6] =
                 (unsigned_long)local_190;
            ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar22 = ppVar8[-1].first;
          uVar23 = ppVar8[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar8 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            if (uVar22 != ppVar8[-1].first) break;
            ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar8 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar8[-1].second - uVar6] = uVar23;
          }
          pvVar38 = local_170;
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_138.first =
           (pvVar38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar31];
      local_138.second = (unsigned_long)local_190;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)local_190;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar31 != 0);
  }
  if (local_188 != (_Elt_pointer)0x0) {
    local_88 = (_Elt_pointer)((long)&local_188[-1].second + 7);
    local_78 = (long)local_188 * 0x10 + -0x10;
    ppVar8 = (_Elt_pointer)0x0;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_180 = (_Elt_pointer)((long)&local_188->first + ~(ulong)ppVar8);
      local_128 = (_Elt_pointer)((long)local_180 * 0x10);
      local_190 = (_Elt_pointer)
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_180].second;
      ppVar35 = local_110.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_180;
      local_178 = (comm *)ppVar8;
      do {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (ppVar8[-1].first <= ppVar35->first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar22 = ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar22 + 0x1f8) - uVar6] =
               (unsigned_long)local_190;
          ppVar8 = (_Elt_pointer)(uVar22 + 0x200);
        }
        else {
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar6] =
               (unsigned_long)local_190;
          ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar22 = ppVar8[-1].first;
        uVar23 = ppVar8[-1].second;
        while( true ) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar8 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (uVar22 != ppVar8[-1].first) break;
          ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar8 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar8[-1].second - uVar6] = uVar23;
        }
      } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      pcVar14 = local_178;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        if (*(unsigned_long *)
             ((long)&local_128->first +
             (long)&(local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar8[-1].first) {
          ppVar8 = local_180;
          if (local_180 != (_Elt_pointer)0x0) {
            plVar7 = (long *)((long)&local_110.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-(long)local_178].
                                     first + local_78);
            do {
              if (*plVar7 != plVar7[-2]) goto LAB_001346d1;
              pcVar14 = (comm *)((long)&((_Elt_pointer)pcVar14)->first + 1);
              plVar7 = plVar7 + -2;
              ppVar8 = (_Elt_pointer)((long)ppVar8 + -1);
            } while (ppVar8 != (_Elt_pointer)0x0);
            ppVar8 = (_Elt_pointer)0x0;
            pcVar14 = (comm *)local_88;
          }
LAB_001346d1:
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar9 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              if (ppVar9[-1].first !=
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)ppVar8].first) break;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [*(long *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f8) - uVar6] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar8].second;
                operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar6] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar8].second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
          }
        }
      }
      ppVar8 = (_Elt_pointer)((long)&((_Elt_pointer)pcVar14)->first + 1);
    } while (ppVar8 < local_188);
  }
  pppVar4 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar11 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_180 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_178 = (comm *)(left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    ppVar10 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar39 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar29 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar15 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_190 = ppVar10;
      ppVar21 = ppVar39;
      ppVar30 = ppVar29;
      while( true ) {
        lVar31 = (long)ppVar21 - (long)ppVar30 >> 4;
        uVar13 = lVar31 - 1;
        if (uVar13 < 0x20) {
          ppVar26 = ppVar21 + -1;
        }
        else {
          uVar25 = uVar13 >> 5 | 0xf800000000000000;
          if (1 < lVar31) {
            uVar25 = uVar13 >> 5;
          }
          ppVar26 = (_Elt_pointer)((uVar13 + uVar25 * -0x20) * 0x10 + (&local_190->first)[uVar25]);
        }
        if (ppVar26 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar26 = ppVar39;
        if (ppVar39 == ppVar29) {
          ppVar26 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
        }
        if (uVar13 < 0x20) {
          ppVar34 = ppVar21 + -1;
          ppVar19 = ppVar30;
          ppVar36 = local_190;
        }
        else {
          uVar25 = uVar13 >> 5 | 0xf800000000000000;
          if (1 < lVar31) {
            uVar25 = uVar13 >> 5;
          }
          ppVar36 = (_Elt_pointer)(&local_190->first + uVar25);
          ppVar19 = (_Elt_pointer)ppVar36->first;
          ppVar34 = ppVar19 + uVar13 + uVar25 * -0x20;
        }
        if (ppVar34 == ppVar19) {
          ppVar34 = (_Elt_pointer)(ppVar36[-1].second + 0x200);
        }
        if (ppVar26[-1].first != ppVar34[-1].first) break;
        if (ppVar21 == ppVar30) {
          ppVar30 = (_Elt_pointer)local_190[-1].second;
          local_190 = (_Elt_pointer)&local_190[-1].second;
          ppVar21 = ppVar30 + 0x20;
        }
        ppVar26 = ppVar39;
        if (ppVar39 == ppVar29) {
          ppVar26 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
        }
        ppVar21 = ppVar21 + -1;
        ppVar34 = ppVar21;
        if (ppVar21 == ppVar30) {
          ppVar34 = (_Elt_pointer)(local_190[-1].second + 0x200);
        }
        puVar15[ppVar34[-1].second - uVar6] = ppVar26[-1].second;
      }
      if (ppVar39 == ppVar29) {
        ppVar39 = (_Elt_pointer)(ppVar10[-1].second + 0x200);
      }
      *(unsigned_long *)((long)local_178 + (ppVar39[-1].second - uVar6) * 8) = local_120;
      if (ppVar21 == ppVar30) {
        ppVar30 = (_Elt_pointer)local_190[-1].second;
        local_190 = (_Elt_pointer)&local_190[-1].second;
        ppVar21 = ppVar30 + 0x20;
      }
      ppVar39 = ppVar21 + -1;
      ppVar10 = local_190;
      ppVar29 = ppVar30;
    } while (ppVar39 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ppVar10 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_start._M_node <
      local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      puVar16 = &ppVar10->second;
      operator_delete((void *)ppVar10->second);
      ppVar10 = (_Elt_pointer)puVar16;
    } while (puVar16 < local_180);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar8;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar4;
  puVar15 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar15) {
    uVar13 = 0;
    do {
      ppVar8 = (_Elt_pointer)(uVar13 + uVar6);
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        bVar40 = false;
        do {
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          if (ppVar9[-1].first <= puVar15[uVar13]) {
            if (!bVar40) {
              ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar9 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              if (puVar15[uVar13] == ppVar9[-1].first) {
                ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar9 = (_Elt_pointer)
                           (((_Elt_pointer)
                            ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                            -0x10))->second + 0x200);
                }
                (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[ppVar9[-1].second - uVar6] =
                     (unsigned_long)ppVar8;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar9 = (_Elt_pointer)
                     (((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second + 0x200);
          }
          (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar9[-1].second - uVar6] = (unsigned_long)ppVar8;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar40 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar40);
      }
      local_138.first =
           (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar13];
      local_138.second = (unsigned_long)ppVar8;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_138);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)ppVar8;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar13 = uVar13 + 1;
      puVar15 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(local_170->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 3
                             ));
  }
  if (local_80 != local_188) {
    lVar17 = (long)local_80 - (long)local_188;
    lVar31 = 0;
    local_188 = (_Elt_pointer)((long)local_188 << 4);
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar16 = &(local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar8 = local_188 + lVar31;
      uVar22 = *(unsigned_long *)((long)&local_188[lVar31].second + (long)puVar16);
      bVar40 = false;
      do {
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        uVar13 = *(ulong *)((long)&ppVar8->first + (long)puVar16);
        if (ppVar9[-1].first <= uVar13) {
          if (!bVar40) {
            ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar8 = (_Elt_pointer)
                       (((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second + 0x200);
            }
            if (uVar13 == ppVar8[-1].first) {
              ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar8 = (_Elt_pointer)
                         (((_Elt_pointer)
                          ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10)
                          )->second + 0x200);
              }
              (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar8[-1].second - uVar6] = uVar22;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar9 = (_Elt_pointer)
                   (((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second + 0x200);
        }
        (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar9[-1].second - uVar6] = uVar22;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar40 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar40);
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar17 + (ulong)(lVar17 == 0));
  }
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar15 = (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    ppVar11 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar8 == ppVar9) {
        puVar15[*(long *)(ppVar11[-1].second + 0x1f8) - uVar6] = local_120;
        ppVar9 = (_Elt_pointer)ppVar11[-1].second;
        ppVar11 = (_Elt_pointer)&ppVar11[-1].second;
        ppVar8 = ppVar9 + 0x20;
      }
      else {
        puVar15[ppVar8[-1].second - uVar6] = local_120;
      }
      ppVar8 = ppVar8 + -1;
    } while (ppVar8 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_168,&local_110);
  if (local_110.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}